

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_NoiseBox.cpp
# Opt level: O2

int NoiseBox::ProcessCallback
              (UnityAudioEffectState *state,float *inbuffer,float *outbuffer,uint length,
              int inchannels,int outchannels)

{
  float fVar1;
  uint uVar2;
  EffectData *pEVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  pEVar3 = UnityAudioEffectState::GetEffectData<NoiseBox::EffectData>(state);
  if (((state->field_0).field_0.flags & 7) == 1) {
    fVar9 = (float)(state->field_0).field_0.samplerate * 0.5;
    fVar13 = fVar9 / (pEVar3->field_0).data.p[2];
    fVar1 = (pEVar3->field_0).data.p[3];
    fVar10 = powf(10.0,(pEVar3->field_0).data.p[0] * 0.05);
    fVar11 = powf(10.0,(pEVar3->field_0).data.p[1] * 0.05);
    uVar4 = 0;
    uVar7 = 0;
    if (0 < outchannels) {
      uVar7 = (ulong)(uint)outchannels;
    }
    for (uVar8 = 0; iVar6 = (int)uVar4, uVar5 = uVar7, uVar8 != length; uVar8 = uVar8 + 1) {
      while (uVar5 != 0) {
        outbuffer[uVar4] =
             ((pEVar3->field_0).data.mulnoise * fVar11 + (1.0 - fVar11)) * inbuffer[uVar4] +
             (pEVar3->field_0).data.addnoise * fVar10;
        uVar4 = (ulong)((int)uVar4 + 1);
        uVar5 = uVar5 - 1;
      }
      fVar12 = (pEVar3->field_0).data.addcount + 1.0;
      (pEVar3->field_0).data.addcount = fVar12;
      if (fVar13 <= fVar12) {
        (pEVar3->field_0).data.addcount = fVar12 - fVar13;
        fVar12 = Random::GetFloat(&(pEVar3->field_0).data.random,-1.0,1.0);
        (pEVar3->field_0).data.addnoise = fVar12;
      }
      fVar12 = (pEVar3->field_0).data.mulcount + 1.0;
      (pEVar3->field_0).data.mulcount = fVar12;
      if (fVar13 <= fVar12) {
        (pEVar3->field_0).data.mulcount = fVar12 - fVar9 / fVar1;
        uVar2 = *(int *)((long)&pEVar3->field_0 + 0x20) * 0x19660d + 0x3c6ef35f;
        *(uint *)((long)&pEVar3->field_0 + 0x20) = uVar2;
        (pEVar3->field_0).data.mulnoise =
             (float)(uVar2 & 0xffffff ^ uVar2 >> 0x10) * 5.960465e-08 + 0.0;
      }
      uVar4 = (ulong)(uint)(iVar6 + outchannels);
    }
  }
  else {
    memcpy(outbuffer,inbuffer,(long)inchannels * (ulong)length * 4);
  }
  return 0;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK ProcessCallback(UnityAudioEffectState* state, float* inbuffer, float* outbuffer, unsigned int length, int inchannels, int outchannels)
    {
        EffectData::Data* data = &state->GetEffectData<EffectData>()->data;

        if ((state->flags & UnityAudioEffectStateFlags_IsPlaying) == 0 || (state->flags & (UnityAudioEffectStateFlags_IsMuted | UnityAudioEffectStateFlags_IsPaused)) != 0)
        {
            memcpy(outbuffer, inbuffer, sizeof(float) * length * inchannels);
            return UNITY_AUDIODSP_OK;
        }

        const float addperiod = state->samplerate * 0.5f / data->p[P_ADDFREQ];
        const float mulperiod = state->samplerate * 0.5f / data->p[P_MULFREQ];
        const float addgain = powf(10.0f, 0.05f * data->p[P_ADDAMT]);
        const float mulgain = powf(10.0f, 0.05f * data->p[P_MULAMT]);

        for (unsigned int n = 0; n < length; n++)
        {
            for (int i = 0; i < outchannels; i++)
            {
                outbuffer[n * outchannels + i] = inbuffer[n * outchannels + i] * (1.0f - mulgain + mulgain * data->mulnoise) + addgain * data->addnoise;
            }
            data->addcount += 1.0f; if (data->addcount >= addperiod)
            {
                data->addcount -= addperiod; data->addnoise = data->random.GetFloat(-1.0, 1.0f);
            }
            data->mulcount += 1.0f; if (data->mulcount >= addperiod)
            {
                data->mulcount -= mulperiod; data->mulnoise = data->random.GetFloat(0.0, 1.0f);
            }
        }

        return UNITY_AUDIODSP_OK;
    }